

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCMakeInputs
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  string *psVar1;
  Value *pVVar2;
  Value local_128;
  Value local_100;
  Value local_d8;
  undefined1 local_b0 [8];
  Value result;
  string *sourceDir;
  string cmakeRootDir;
  cmake *cm;
  allocator<char> local_41;
  string local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServerProtocol1 *)__return_storage_ptr__;
  if ((int)this->m_State < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"This instance was not yet configured.",&local_41);
    cmServerRequest::ReportError(__return_storage_ptr__,request,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    cmakeRootDir.field_2._8_8_ = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
    psVar1 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    std::__cxx11::string::string((string *)&sourceDir,(string *)psVar1);
    result.limit_ =
         (ptrdiff_t)cmake::GetHomeDirectory_abi_cxx11_((cmake *)cmakeRootDir.field_2._8_8_);
    Json::Value::Value((Value *)local_b0,objectValue);
    Json::Value::Value(&local_d8,(string *)result.limit_);
    pVVar2 = Json::Value::operator[]((Value *)local_b0,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_d8);
    Json::Value::~Value(&local_d8);
    Json::Value::Value(&local_100,(string *)&sourceDir);
    pVVar2 = Json::Value::operator[]((Value *)local_b0,&kCMAKE_ROOT_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_100);
    Json::Value::~Value(&local_100);
    cmDumpCMakeInputs(&local_128,(cmake *)cmakeRootDir.field_2._8_8_);
    pVVar2 = Json::Value::operator[]((Value *)local_b0,&kBUILD_FILES_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_128);
    Json::Value::~Value(&local_128);
    cmServerRequest::Reply(__return_storage_ptr__,local_20,(Value *)local_b0);
    Json::Value::~Value((Value *)local_b0);
    std::__cxx11::string::~string((string *)&sourceDir);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCMakeInputs(
  const cmServerRequest& request)
{
  if (this->m_State < STATE_CONFIGURED) {
    return request.ReportError("This instance was not yet configured.");
  }

  const cmake* cm = this->CMakeInstance();
  const std::string cmakeRootDir = cmSystemTools::GetCMakeRoot();
  const std::string& sourceDir = cm->GetHomeDirectory();

  Json::Value result = Json::objectValue;
  result[kSOURCE_DIRECTORY_KEY] = sourceDir;
  result[kCMAKE_ROOT_DIRECTORY_KEY] = cmakeRootDir;
  result[kBUILD_FILES_KEY] = cmDumpCMakeInputs(cm);
  return request.Reply(result);
}